

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

void __thiscall n_e_s::core::Mos6502::adc_impl(Mos6502 *this,uint8_t addend)

{
  uint8_t reg_value;
  code *pcVar1;
  ushort resulting_value;
  int iVar2;
  bool bVar3;
  uint16_t temp_result;
  uint8_t carry;
  uint8_t a_before;
  uint8_t addend_local;
  Mos6502 *this_local;
  
  reg_value = this->registers_->a;
  bVar3 = (this->registers_->p & 1) != 0;
  iVar2 = (uint)this->registers_->a + (uint)addend;
  resulting_value = (short)iVar2 + (ushort)bVar3;
  if (SCARRY4(iVar2,(uint)bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this->registers_->a = (uint8_t)resulting_value;
  set_carry(this,0xff < resulting_value);
  set_zero(this,this->registers_->a);
  set_negative(this,this->registers_->a);
  set_overflow(this,reg_value,addend,resulting_value);
  return;
}

Assistant:

void Mos6502::adc_impl(const uint8_t addend) {
    const uint8_t a_before = registers_->a;
    const uint8_t carry = registers_->p & C_FLAG ? static_cast<uint8_t>(1u)
                                                 : static_cast<uint8_t>(0u);
    const uint16_t temp_result = registers_->a + addend + carry;
    registers_->a = static_cast<uint8_t>(temp_result);

    set_carry(temp_result > 0xFF);
    set_zero(registers_->a);
    set_negative(registers_->a);
    set_overflow(a_before, addend, temp_result);
}